

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::IntStateScatterAcceleration
          (ChMatterMeshless *this,uint off_a,ChStateDelta *a)

{
  pointer psVar1;
  element_type *peVar2;
  ulong start;
  uint uVar3;
  ChVector<double> local_88;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_68 [56];
  
  start = (ulong)off_a;
  uVar3 = 0;
  while( true ) {
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar3) break;
    peVar2 = psVar1[uVar3].
             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
               &a->super_ChVectorDynamic<double>,start,3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_88,local_68,(type *)0x0);
    if ((ChVector<double> *)((long)&peVar2->super_ChNodeXYZ + 0x38U) != &local_88) {
      ((ChVector<double> *)((long)&peVar2->super_ChNodeXYZ + 0x38))->m_data[0] = local_88.m_data[0];
      *(double *)((long)&peVar2->super_ChNodeXYZ + 0x40) = local_88.m_data[1];
      *(double *)((long)&peVar2->super_ChNodeXYZ + 0x48) = local_88.m_data[2];
    }
    uVar3 = uVar3 + 1;
    start = (ulong)((int)start + 3);
  }
  return;
}

Assistant:

void ChMatterMeshless::IntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->SetPos_dtdt(a.segment(off_a + 3 * j, 3));
    }
}